

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrunner.cpp
# Opt level: O2

Ref __thiscall trun::TestRunner::GetOrAddModule(TestRunner *this,string *moduleName)

{
  iterator iVar1;
  key_type *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  Ref RVar3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>_>
  local_50;
  
  this->pLogger = (ILogger *)0x0;
  (this->library).super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>_>_>_>
                  *)((moduleName->field_2)._M_local_buf + 8),in_RDX);
  if (iVar1._M_node == (_Base_ptr)(moduleName + 1)) {
    TestModule::Create(&local_50.first);
    std::__shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2> *)&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50.first._M_string_length);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>_>
    ::pair<std::shared_ptr<trun::TestModule>_&,_true>
              (&local_50,in_RDX,(shared_ptr<trun::TestModule> *)this);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,std::shared_ptr<trun::TestModule>>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>
                *)((moduleName->field_2)._M_local_buf + 8),&local_50);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>_>
    ::~pair(&local_50);
    _Var2._M_pi = extraout_RDX_00;
  }
  else {
    std::__shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2> *)(iVar1._M_node + 2));
    _Var2._M_pi = extraout_RDX;
  }
  RVar3.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  RVar3.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ref)RVar3.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TestModule::Ref TestRunner::GetOrAddModule(const std::string &moduleName) {
    TestModule::Ref tModule = nullptr;

    auto it = testModules.find(moduleName);
    if (it == testModules.end()) {
        tModule = TestModule::Create(moduleName);
        // Note: Don't filter modules here - as we use this list during 'dry-run'..
        testModules.insert(std::pair<std::string, TestModule::Ref>(moduleName, tModule));
    } else {
        tModule = it->second;
    }
    return tModule;
}